

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> __thiscall Parser::parseStmt(Parser *this)

{
  Parser *in_RSI;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> local_1e8;
  unique_ptr<AST::AssignStmt,_std::default_delete<AST::AssignStmt>_> local_1e0;
  undefined1 local_1d8 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> rval;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> expr;
  undefined1 local_1c0 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> expr_3;
  undefined1 local_1a8 [8];
  unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> body_2;
  Token param;
  vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
  params;
  Token id_2;
  unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> local_128;
  undefined1 local_120 [8];
  Token id_1;
  undefined1 local_f0 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> expr_2;
  undefined1 local_e0 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> expr_1;
  undefined1 local_c8 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> val;
  Token id;
  unique_ptr<AST::NextStmt,_std::default_delete<AST::NextStmt>_> local_90;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> local_88;
  undefined1 local_80 [8];
  unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> body_1;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> cond_1;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> local_68;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> local_60;
  unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> local_58;
  unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> falseBody_1;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> local_48;
  undefined1 local_40 [8];
  unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> falseBody;
  undefined1 local_28 [8];
  unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> body;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> cond;
  Parser *this_local;
  
  if ((in_RSI->m_currToken).type == END) {
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<std::default_delete<AST::Stmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,(nullptr_t)0x0);
  }
  else if ((in_RSI->m_currToken).type == EOL) {
    eatToken(in_RSI,EOL);
    parseStmt(this);
  }
  else if (((in_RSI->m_currToken).type == If) || ((in_RSI->m_currToken).type == Elif)) {
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    parseExpr((Parser *)&body);
    parseBlockStmt((Parser *)local_28);
    if ((in_RSI->m_currToken).type == Elif) {
      parseStmt((Parser *)local_40);
      std::
      make_unique<AST::IfStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>,std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>
                (&local_48,&body,(unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)local_28)
      ;
      std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
      unique_ptr<AST::IfStmt,std::default_delete<AST::IfStmt>,void>
                ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
                 (unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_> *)&local_48);
      std::unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_>::~unique_ptr
                ((unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_> *)&local_48);
      falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
      _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
      super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>::~unique_ptr
                ((unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)local_40);
    }
    else if ((in_RSI->m_currToken).type == Else) {
      eatToken(in_RSI,Else);
      parseBlockStmt((Parser *)&local_58);
      std::
      make_unique<AST::IfStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>>
                (&local_60,&body,
                 (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_28);
      std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
      unique_ptr<AST::IfStmt,std::default_delete<AST::IfStmt>,void>
                ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
                 (unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_> *)&local_60);
      std::unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_>::~unique_ptr
                ((unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_> *)&local_60);
      falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
      _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
      super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>::~unique_ptr(&local_58);
    }
    else {
      std::
      make_unique<AST::IfStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>,decltype(nullptr)>
                (&local_68,&body,(void **)local_28);
      std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
      unique_ptr<AST::IfStmt,std::default_delete<AST::IfStmt>,void>
                ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
                 (unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_> *)&local_68);
      std::unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_>::~unique_ptr
                ((unique_ptr<AST::IfStmt,_std::default_delete<AST::IfStmt>_> *)&local_68);
      falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
      _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
      super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    }
    std::unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>::~unique_ptr
              ((unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_28);
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&body);
  }
  else if ((in_RSI->m_currToken).type == While) {
    eatToken(in_RSI,While);
    parseExpr((Parser *)&body_1);
    parseBlockStmt((Parser *)local_80);
    std::
    make_unique<AST::WhileStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>>
              (&local_88,&body_1);
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::WhileStmt,std::default_delete<AST::WhileStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::WhileStmt,_std::default_delete<AST::WhileStmt>_> *)&local_88);
    std::unique_ptr<AST::WhileStmt,_std::default_delete<AST::WhileStmt>_>::~unique_ptr
              ((unique_ptr<AST::WhileStmt,_std::default_delete<AST::WhileStmt>_> *)&local_88);
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>::~unique_ptr
              ((unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_80);
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&body_1);
  }
  else if ((in_RSI->m_currToken).type == Next) {
    eatToken(in_RSI,Next);
    std::make_unique<AST::NextStmt>();
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::NextStmt,std::default_delete<AST::NextStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,&local_90);
    std::unique_ptr<AST::NextStmt,_std::default_delete<AST::NextStmt>_>::~unique_ptr(&local_90);
  }
  else if ((in_RSI->m_currToken).type == Break) {
    eatToken(in_RSI,Break);
    std::make_unique<AST::BreakStmt>();
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::BreakStmt,std::default_delete<AST::BreakStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::BreakStmt,_std::default_delete<AST::BreakStmt>_> *)
               ((long)&id.literal.field_2 + 8));
    std::unique_ptr<AST::BreakStmt,_std::default_delete<AST::BreakStmt>_>::~unique_ptr
              ((unique_ptr<AST::BreakStmt,_std::default_delete<AST::BreakStmt>_> *)
               ((long)&id.literal.field_2 + 8));
  }
  else if ((in_RSI->m_currToken).type == Let) {
    eatToken(in_RSI,Let);
    Token::Token((Token *)&val,&in_RSI->m_currToken);
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,Equal);
    parseExpr((Parser *)local_c8);
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr_1);
    std::
    make_unique<AST::LetStmt,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
               &stack0xffffffffffffff30,&expr_1);
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::LetStmt,std::default_delete<AST::LetStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::LetStmt,_std::default_delete<AST::LetStmt>_> *)
               &stack0xffffffffffffff30);
    std::unique_ptr<AST::LetStmt,_std::default_delete<AST::LetStmt>_>::~unique_ptr
              ((unique_ptr<AST::LetStmt,_std::default_delete<AST::LetStmt>_> *)
               &stack0xffffffffffffff30);
    std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::~unique_ptr
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)&expr_1);
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_c8);
    Token::~Token((Token *)&val);
  }
  else if ((in_RSI->m_currToken).type == Print) {
    eatToken(in_RSI,Print);
    parseExpr((Parser *)local_e0);
    std::make_unique<AST::PrintStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              (&expr_2);
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::PrintStmt,std::default_delete<AST::PrintStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::PrintStmt,_std::default_delete<AST::PrintStmt>_> *)&expr_2);
    std::unique_ptr<AST::PrintStmt,_std::default_delete<AST::PrintStmt>_>::~unique_ptr
              ((unique_ptr<AST::PrintStmt,_std::default_delete<AST::PrintStmt>_> *)&expr_2);
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_e0);
  }
  else if ((in_RSI->m_currToken).type == Err) {
    eatToken(in_RSI,Err);
    parseExpr((Parser *)local_f0);
    std::make_unique<AST::ErrStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
               ((long)&id_1.literal.field_2 + 8));
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::ErrStmt,std::default_delete<AST::ErrStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::ErrStmt,_std::default_delete<AST::ErrStmt>_> *)
               ((long)&id_1.literal.field_2 + 8));
    std::unique_ptr<AST::ErrStmt,_std::default_delete<AST::ErrStmt>_>::~unique_ptr
              ((unique_ptr<AST::ErrStmt,_std::default_delete<AST::ErrStmt>_> *)
               ((long)&id_1.literal.field_2 + 8));
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_f0);
  }
  else if ((in_RSI->m_currToken).type == Scan) {
    eatToken(in_RSI,Scan);
    Token::Token((Token *)local_120,&in_RSI->m_currToken);
    eatToken(in_RSI,Identifier);
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&id_2.literal.field_2 + 8));
    std::
    make_unique<AST::ScanStmt,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>
              (&local_128);
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::ScanStmt,std::default_delete<AST::ScanStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::ScanStmt,_std::default_delete<AST::ScanStmt>_> *)&local_128);
    std::unique_ptr<AST::ScanStmt,_std::default_delete<AST::ScanStmt>_>::~unique_ptr
              ((unique_ptr<AST::ScanStmt,_std::default_delete<AST::ScanStmt>_> *)&local_128);
    std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::~unique_ptr
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
               ((long)&id_2.literal.field_2 + 8));
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    Token::~Token((Token *)local_120);
  }
  else if ((in_RSI->m_currToken).type == Def) {
    eatToken(in_RSI,Def);
    Token::Token((Token *)&params.
                           super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&in_RSI->m_currToken);
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,LeftParen);
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::vector((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
              *)((long)&param.literal.field_2 + 8));
    while ((in_RSI->m_currToken).type != RightParen) {
      Token::Token((Token *)&stack0xfffffffffffffe68,&in_RSI->m_currToken);
      eatToken(in_RSI,Identifier);
      if ((in_RSI->m_currToken).type != RightParen) {
        eatToken(in_RSI,Comma);
      }
      std::make_unique<AST::Identifier,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&body_2);
      std::
      vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
      ::push_back((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                   *)((long)&param.literal.field_2 + 8),(value_type *)&body_2);
      std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::~unique_ptr
                ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)&body_2);
      Token::~Token((Token *)&stack0xfffffffffffffe68);
    }
    eatToken(in_RSI,RightParen);
    parseBlockStmt((Parser *)local_1a8);
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr_3);
    std::
    make_unique<AST::FnDecl,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>>
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
               &stack0xfffffffffffffe50,
               (vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                *)&expr_3,
               (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)
               ((long)&param.literal.field_2 + 8));
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::FnDecl,std::default_delete<AST::FnDecl>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::FnDecl,_std::default_delete<AST::FnDecl>_> *)
               &stack0xfffffffffffffe50);
    std::unique_ptr<AST::FnDecl,_std::default_delete<AST::FnDecl>_>::~unique_ptr
              ((unique_ptr<AST::FnDecl,_std::default_delete<AST::FnDecl>_> *)
               &stack0xfffffffffffffe50);
    std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::~unique_ptr
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)&expr_3);
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>::~unique_ptr
              ((unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_1a8);
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::~vector((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
               *)((long)&param.literal.field_2 + 8));
    Token::~Token((Token *)&params.
                            super__Vector_base<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else if ((in_RSI->m_currToken).type == Return) {
    eatToken(in_RSI,Return);
    parseExpr((Parser *)local_1c0);
    std::make_unique<AST::ReturnStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              (&expr);
    std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
    unique_ptr<AST::ReturnStmt,std::default_delete<AST::ReturnStmt>,void>
              ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
               (unique_ptr<AST::ReturnStmt,_std::default_delete<AST::ReturnStmt>_> *)&expr);
    std::unique_ptr<AST::ReturnStmt,_std::default_delete<AST::ReturnStmt>_>::~unique_ptr
              ((unique_ptr<AST::ReturnStmt,_std::default_delete<AST::ReturnStmt>_> *)&expr);
    falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
    _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
    super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_1c0);
  }
  else {
    parseExpr((Parser *)&rval);
    if ((in_RSI->m_currToken).type == Equal) {
      eatToken(in_RSI,Equal);
      parseExpr((Parser *)local_1d8);
      std::
      make_unique<AST::AssignStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
                ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&local_1e0,&rval);
      std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
      unique_ptr<AST::AssignStmt,std::default_delete<AST::AssignStmt>,void>
                ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,&local_1e0);
      std::unique_ptr<AST::AssignStmt,_std::default_delete<AST::AssignStmt>_>::~unique_ptr
                (&local_1e0);
      falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
      _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
      super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
                ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_1d8);
    }
    else {
      std::make_unique<AST::ExprStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
                (&local_1e8);
      std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>::
      unique_ptr<AST::ExprStmt,std::default_delete<AST::ExprStmt>,void>
                ((unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>> *)this,
                 (unique_ptr<AST::ExprStmt,_std::default_delete<AST::ExprStmt>_> *)&local_1e8);
      std::unique_ptr<AST::ExprStmt,_std::default_delete<AST::ExprStmt>_>::~unique_ptr
                ((unique_ptr<AST::ExprStmt,_std::default_delete<AST::ExprStmt>_> *)&local_1e8);
      falseBody_1._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
      _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
      super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
    }
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr(&rval);
  }
  return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
         (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Stmt> Parser::parseStmt() {
    if (m_currToken.type == TokenType::END) {
        return nullptr;
    }
    if (m_currToken.type == TokenType::EOL) {
        eatToken(TokenType::EOL);
        return parseStmt();
    }
    if (m_currToken.type == TokenType::If || m_currToken.type == TokenType::Elif) {
        eatToken(m_currToken.type);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        if (m_currToken.type == TokenType::Elif) {
            auto falseBody = parseStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        } else if (m_currToken.type == TokenType::Else) {
            eatToken(TokenType::Else);
            auto falseBody = parseBlockStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        }

        return std::make_unique<AST::IfStmt>(std::move(cond), std::move(body), nullptr);
    }

    if (m_currToken.type == TokenType::While) {
        eatToken(TokenType::While);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        return std::make_unique<AST::WhileStmt>(std::move(cond), std::move(body));
    }

    if (m_currToken.type == TokenType::Next) {
        eatToken(TokenType::Next);
        return std::make_unique<AST::NextStmt>();
    }

    if (m_currToken.type == TokenType::Break) {
        eatToken(TokenType::Break);
        return std::make_unique<AST::BreakStmt>();
    }

    if (m_currToken.type == TokenType::Let) {
        eatToken(TokenType::Let);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::Equal);
        auto val = parseExpr();
        return std::make_unique<AST::LetStmt>(std::make_unique<AST::Identifier>(id.literal), std::move(val));
    }

    if (m_currToken.type == TokenType::Print) {
        eatToken(TokenType::Print);
        auto expr = parseExpr();
        return std::make_unique<AST::PrintStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Err) {
        eatToken(TokenType::Err);
        auto expr = parseExpr();
        return std::make_unique<AST::ErrStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Scan) {
        eatToken(TokenType::Scan);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        return std::make_unique<AST::ScanStmt>(std::make_unique<AST::Identifier>(id.literal));
    }

    if (m_currToken.type == TokenType::Def) {
        eatToken(TokenType::Def);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::LeftParen);
        std::vector<std::unique_ptr<AST::Identifier>> params;
        while (m_currToken.type != TokenType::RightParen) {
            Token param = m_currToken;
            eatToken(TokenType::Identifier);
            if (m_currToken.type != TokenType::RightParen) {
                eatToken(TokenType::Comma);
            }
            params.push_back(std::make_unique<AST::Identifier>(param.literal));
        }
        eatToken(TokenType::RightParen);
        auto body = parseBlockStmt();
        return std::make_unique<AST::FnDecl>(std::make_unique<AST::Identifier>(id.literal),
                                             std::move(params),
                                             std::move(body));
    }

    if (m_currToken.type == TokenType::Return) {
        eatToken(TokenType::Return);
        std::unique_ptr<AST::Expr> expr = parseExpr();
        return std::make_unique<AST::ReturnStmt>(std::move(expr));
    }

    // assignment or expr statement
    std::unique_ptr<AST::Expr> expr = parseExpr();
    if (m_currToken.type == TokenType::Equal) {
        eatToken(TokenType::Equal);
        auto rval = parseExpr();
        // TODO: add checks that lval is valid.
        return std::make_unique<AST::AssignStmt>(std::move(expr), std::move(rval));
    } else {
        return std::make_unique<AST::ExprStmt>(std::move(expr));
    }
}